

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O1

void __thiscall
slang::analysis::AnalysisScopeVisitor::visitMembers<slang::ast::SpecifyBlockSymbol>
          (AnalysisScopeVisitor *this,SpecifyBlockSymbol *symbol)

{
  Symbol *member;
  Symbol *this_00;
  
  if ((symbol->super_Scope).deferredMemberIndex != Invalid) {
    ast::Scope::elaborate(&symbol->super_Scope);
  }
  for (this_00 = (symbol->super_Scope).firstMember; this_00 != (Symbol *)0x0;
      this_00 = this_00->nextInScope) {
    ast::Symbol::visit<slang::analysis::AnalysisScopeVisitor&>(this_00,this);
  }
  return;
}

Assistant:

void visitMembers(const T& symbol) {
        for (auto& member : symbol.members())
            member.visit(*this);
    }